

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# waiting.hh
# Opt level: O3

void __thiscall
tchecker::waiting::
fast_remove_waiting_t<tchecker::waiting::stack_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>
::remove_first(fast_remove_waiting_t<tchecker::waiting::stack_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>
               *this)

{
  _Elt_pointer piVar1;
  
  remove_non_waiting_first(this);
  piVar1 = (this->_w)._dq.
           super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (piVar1 == (this->_w)._dq.
                super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    __assert_fail("!_w.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/waiting/waiting.hh"
                  ,0xc2,
                  "virtual void tchecker::waiting::fast_remove_waiting_t<tchecker::waiting::stack_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t, tchecker::tck_reach::zg_covreach::edge_t>>>>>::remove_first() [W = tchecker::waiting::stack_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t, tchecker::tck_reach::zg_covreach::edge_t>>>>]"
                 );
  }
  if (piVar1 == (this->_w)._dq.
                super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    piVar1 = (this->_w)._dq.
             super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  if (piVar1[-1]._t !=
      (make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>
       *)0x0) {
    ((piVar1[-1]._t)->
    super_node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>
    ).super_node_t.super_element_t._status = NOT_WAITING;
    std::
    deque<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t,_tchecker::tck_reach::zg_covreach::edge_t>,_unsigned_long,_1UL>_>_>_>
    ::pop_back(&(this->_w)._dq);
    return;
  }
  __assert_fail("_t != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                ,0x1db,
                "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t, tchecker::tck_reach::zg_covreach::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::subsumption::node_t<tchecker::tck_reach::zg_covreach::node_t, tchecker::tck_reach::zg_covreach::edge_t>>]"
               );
}

Assistant:

virtual void remove_first()
  {
    remove_non_waiting_first();
    assert(!_w.empty());
    _w.first()->_status = tchecker::waiting::NOT_WAITING;
    _w.remove_first();
  }